

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O2

void __thiscall
Js::ScriptFunction::ReplaceTypeWithPredecessorType(ScriptFunction *this,DynamicType *previousType)

{
  ProxyEntryPointInfo *oldEntryPointInfo;
  
  oldEntryPointInfo =
       (ProxyEntryPointInfo *)
       (this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
       super_RecyclableObject.type.ptr[1].prototype.ptr;
  DynamicObject::ReplaceTypeWithPredecessorType((DynamicObject *)this,previousType);
  CopyEntryPointInfoToThreadContextIfNecessary
            (oldEntryPointInfo,
             (ProxyEntryPointInfo *)
             (this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
             super_RecyclableObject.type.ptr[1].prototype.ptr);
  return;
}

Assistant:

void ScriptFunction::ReplaceTypeWithPredecessorType(DynamicType * previousType)
    {
        ProxyEntryPointInfo* oldEntryPointInfo = this->GetScriptFunctionType()->GetEntryPointInfo();
        __super::ReplaceTypeWithPredecessorType(previousType);
        ProxyEntryPointInfo* newEntryPointInfo = this->GetScriptFunctionType()->GetEntryPointInfo();
        CopyEntryPointInfoToThreadContextIfNecessary(oldEntryPointInfo, newEntryPointInfo);
    }